

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QTzTransition>::resize_internal(QList<QTzTransition> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<QTzTransition> *this_00;
  __off_t __length;
  QArrayDataPointer<QTzTransition> *in_RSI;
  QArrayDataPointer<QTzTransition> *in_RDI;
  QArrayDataPointer<QTzTransition> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<QTzTransition> *this_01;
  QArrayDataPointer<QTzTransition> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QTzTransition> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<QTzTransition> *__file;
  
  QArrayDataPointer<QTzTransition>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QTzTransition>::needsDetach(in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 =
         (QArrayDataPointer<QTzTransition> *)capacity((QList<QTzTransition> *)0x757681);
    qVar2 = QArrayDataPointer<QTzTransition>::freeSpaceAtBegin(in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<QTzTransition> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QPodArrayOps<QTzTransition> *)QArrayDataPointer<QTzTransition>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<QTzTransition>::truncate(this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<QTzTransition>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (QTzTransition **)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}